

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger closure_getinfos(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQClosure *pSVar2;
  SQFunctionProto *pSVar3;
  SQObjectValue this;
  SQObjectPtr *pSVar4;
  SQTable *this_00;
  SQArray *pSVar5;
  SQString *pSVar6;
  SQInteger n;
  long lVar7;
  SQNativeClosure *nc;
  long lVar8;
  SQUnsignedInteger n_1;
  long nInitialSize;
  SQClass *nidx;
  SQObjectPtr params;
  SQObjectPtr local_68;
  SQObjectPtr defparams;
  SQObjectPtr local_48;
  SQTable *local_38;
  
  pSVar4 = stack_get(v,1);
  SVar1 = (pSVar4->super_SQObject)._type;
  pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
  this_00 = SQTable::Create(v->_sharedstate,4);
  if (SVar1 == OT_CLOSURE) {
    pSVar3 = pSVar2->_function;
    nInitialSize = (pSVar3->_nparameters + 1) - (ulong)(pSVar3->_varparams == 0);
    local_38 = this_00;
    pSVar5 = SQArray::Create(v->_sharedstate,nInitialSize);
    SQObjectPtr::SQObjectPtr(&params,pSVar5);
    pSVar5 = SQArray::Create(v->_sharedstate,pSVar3->_ndefaultparams);
    SQObjectPtr::SQObjectPtr(&defparams,pSVar5);
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < pSVar3->_nparameters; lVar7 = lVar7 + 1) {
      SQArray::Set(params.super_SQObject._unVal.pArray,lVar7,
                   (SQObjectPtr *)((long)&(pSVar3->_parameters->super_SQObject)._type + lVar8));
      lVar8 = lVar8 + 0x10;
    }
    lVar8 = 0;
    for (lVar7 = 0; this_00 = local_38, this = params.super_SQObject._unVal,
        lVar7 < pSVar3->_ndefaultparams; lVar7 = lVar7 + 1) {
      SQArray::Set(defparams.super_SQObject._unVal.pArray,lVar7,
                   (SQObjectPtr *)((long)&(pSVar2->_defaultparams->super_SQObject)._type + lVar8));
      lVar8 = lVar8 + 0x10;
    }
    if (pSVar3->_varparams != 0) {
      pSVar6 = SQString::Create(v->_sharedstate,"...",-1);
      SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
      SQArray::Set(this.pArray,nInitialSize + -1,&local_68);
      SQObjectPtr::~SQObjectPtr(&local_68);
    }
    pSVar6 = SQString::Create(v->_sharedstate,"native",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    local_48.super_SQObject._type = OT_BOOL;
    local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
    SQTable::NewSlot(this_00,&local_68,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    SQObjectPtr::~SQObjectPtr(&local_68);
    pSVar6 = SQString::Create(v->_sharedstate,"name",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    SQTable::NewSlot(this_00,&local_68,&pSVar3->_name);
    SQObjectPtr::~SQObjectPtr(&local_68);
    pSVar6 = SQString::Create(v->_sharedstate,"src",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    SQTable::NewSlot(this_00,&local_68,&pSVar3->_sourcename);
    SQObjectPtr::~SQObjectPtr(&local_68);
    pSVar6 = SQString::Create(v->_sharedstate,"parameters",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    SQTable::NewSlot(this_00,&local_68,&params);
    SQObjectPtr::~SQObjectPtr(&local_68);
    pSVar6 = SQString::Create(v->_sharedstate,"varargs",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    local_48.super_SQObject._unVal = (SQObjectValue)pSVar3->_varparams;
    local_48.super_SQObject._type = OT_INTEGER;
    SQTable::NewSlot(this_00,&local_68,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    SQObjectPtr::~SQObjectPtr(&local_68);
    pSVar6 = SQString::Create(v->_sharedstate,"defparams",-1);
    SQObjectPtr::SQObjectPtr(&local_68,pSVar6);
    SQTable::NewSlot(this_00,&local_68,&defparams);
    SQObjectPtr::~SQObjectPtr(&local_68);
  }
  else {
    pSVar6 = SQString::Create(v->_sharedstate,"native",-1);
    SQObjectPtr::SQObjectPtr(&params,pSVar6);
    defparams.super_SQObject._type = OT_BOOL;
    defparams.super_SQObject._unVal.nInteger = 1;
    SQTable::NewSlot(this_00,&params,&defparams);
    SQObjectPtr::~SQObjectPtr(&defparams);
    SQObjectPtr::~SQObjectPtr(&params);
    pSVar6 = SQString::Create(v->_sharedstate,"name",-1);
    SQObjectPtr::SQObjectPtr(&params,pSVar6);
    SQTable::NewSlot(this_00,&params,
                     (SQObjectPtr *)&pSVar2[1].super_SQCollectable.super_SQRefCounted._weakref);
    SQObjectPtr::~SQObjectPtr(&params);
    pSVar6 = SQString::Create(v->_sharedstate,"paramscheck",-1);
    SQObjectPtr::SQObjectPtr(&params,pSVar6);
    defparams.super_SQObject._unVal = (SQObjectValue)pSVar2->_env;
    defparams.super_SQObject._type = OT_INTEGER;
    SQTable::NewSlot(this_00,&params,&defparams);
    SQObjectPtr::~SQObjectPtr(&defparams);
    SQObjectPtr::~SQObjectPtr(&params);
    params.super_SQObject._type = OT_NULL;
    params.super_SQObject._unVal.pTable = (SQTable *)0x0;
    if (pSVar2->_base != (SQClass *)0x0) {
      pSVar5 = SQArray::Create(v->_sharedstate,(SQInteger)pSVar2->_base);
      SQObjectPtr::operator=(&params,pSVar5);
      for (nidx = (SQClass *)0x0; nidx < pSVar2->_base;
          nidx = (SQClass *)
                 ((long)&(nidx->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
        defparams.super_SQObject._unVal =
             *(SQObjectValue *)
              (&(pSVar2->_root->super_SQRefCounted)._vptr_SQRefCounted + (long)nidx);
        defparams.super_SQObject._type = OT_INTEGER;
        SQArray::Set(params.super_SQObject._unVal.pArray,(SQInteger)nidx,&defparams);
        SQObjectPtr::~SQObjectPtr(&defparams);
      }
    }
    pSVar6 = SQString::Create(v->_sharedstate,"typecheck",-1);
    SQObjectPtr::SQObjectPtr(&defparams,pSVar6);
    SQTable::NewSlot(this_00,&defparams,&params);
  }
  SQObjectPtr::~SQObjectPtr(&defparams);
  SQObjectPtr::~SQObjectPtr(&params);
  SQObjectPtr::SQObjectPtr(&params,this_00);
  SQVM::Push(v,&params);
  SQObjectPtr::~SQObjectPtr(&params);
  return 1;
}

Assistant:

static SQInteger closure_getinfos(HSQUIRRELVM v) {
    SQObject o = stack_get(v,1);
    SQTable *res = SQTable::Create(_ss(v),4);
    if(type(o) == OT_CLOSURE) {
        SQFunctionProto *f = _closure(o)->_function;
        SQInteger nparams = f->_nparameters + (f->_varparams?1:0);
        SQObjectPtr params = SQArray::Create(_ss(v),nparams);
    SQObjectPtr defparams = SQArray::Create(_ss(v),f->_ndefaultparams);
        for(SQInteger n = 0; n<f->_nparameters; n++) {
            _array(params)->Set((SQInteger)n,f->_parameters[n]);
        }
    for(SQInteger j = 0; j<f->_ndefaultparams; j++) {
            _array(defparams)->Set((SQInteger)j,_closure(o)->_defaultparams[j]);
        }
        if(f->_varparams) {
            _array(params)->Set(nparams-1,SQString::Create(_ss(v),_SC("..."),-1));
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),false);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),f->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("src"),-1),f->_sourcename);
        res->NewSlot(SQString::Create(_ss(v),_SC("parameters"),-1),params);
        res->NewSlot(SQString::Create(_ss(v),_SC("varargs"),-1),f->_varparams);
    res->NewSlot(SQString::Create(_ss(v),_SC("defparams"),-1),defparams);
    }
    else { //OT_NATIVECLOSURE
        SQNativeClosure *nc = _nativeclosure(o);
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),true);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),nc->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("paramscheck"),-1),nc->_nparamscheck);
        SQObjectPtr typecheck;
        if(nc->_typecheck.size() > 0) {
            typecheck =
                SQArray::Create(_ss(v), nc->_typecheck.size());
            for(SQUnsignedInteger n = 0; n<nc->_typecheck.size(); n++) {
                    _array(typecheck)->Set((SQInteger)n,nc->_typecheck[n]);
            }
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("typecheck"),-1),typecheck);
    }
    v->Push(res);
    return 1;
}